

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

void ecs_run_add_actions(ecs_world_t *world,ecs_table_t *table,ecs_data_t *data,int32_t row,
                        int32_t count,ecs_entities_t *added,_Bool get_all,_Bool run_on_set)

{
  int32_t component_count;
  undefined1 local_338 [4];
  int added_count;
  ecs_column_info_t cinfo [32];
  _Bool run_on_set_local;
  _Bool get_all_local;
  ecs_entities_t *added_local;
  int32_t count_local;
  int32_t row_local;
  ecs_data_t *data_local;
  ecs_table_t *table_local;
  ecs_world_t *world_local;
  
  cinfo[0x1f]._23_1_ = get_all;
  cinfo[0x1f]._22_1_ = run_on_set;
  _ecs_assert(added != (ecs_entities_t *)0x0,0xc,(char *)0x0,"added != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x374);
  if (added == (ecs_entities_t *)0x0) {
    __assert_fail("added != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x374,
                  "void ecs_run_add_actions(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_entities_t *, _Bool, _Bool)"
                 );
  }
  _ecs_assert(added->count < 0x20,2,(char *)0x0,"added->count < ECS_MAX_ADD_REMOVE",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x375);
  if (added->count < 0x20) {
    ecs_get_column_info(world,table,added,(ecs_column_info_t *)local_338,
                        (_Bool)(cinfo[0x1f]._23_1_ & 1));
    component_count = added->count;
    if ((table->flags & 4) != 0) {
      ecs_components_override
                (world,table,data,row,count,(ecs_column_info_t *)local_338,component_count,
                 (_Bool)(cinfo[0x1f]._22_1_ & 1));
    }
    if ((table->flags & 0x10000) != 0) {
      ecs_components_switch(world,table,data,row,count,added,(ecs_entities_t *)0x0);
    }
    if ((table->flags & 0x800) != 0) {
      ecs_components_on_add
                (world,table,data,row,count,(ecs_column_info_t *)local_338,component_count);
    }
    return;
  }
  __assert_fail("added->count < (32)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x375,
                "void ecs_run_add_actions(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_entities_t *, _Bool, _Bool)"
               );
}

Assistant:

void ecs_run_add_actions(
    ecs_world_t * world,
    ecs_table_t * table,
    ecs_data_t * data,
    int32_t row,
    int32_t count,
    ecs_entities_t * added,
    bool get_all,
    bool run_on_set)
{
    ecs_assert(added != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(added->count < ECS_MAX_ADD_REMOVE, ECS_INVALID_PARAMETER, NULL);

    ecs_column_info_t cinfo[ECS_MAX_ADD_REMOVE];
    ecs_get_column_info(world, table, added, cinfo, get_all);
    int added_count = added->count;

    if (table->flags & EcsTableHasBase) {
        ecs_components_override(
            world, table, data, row, count, cinfo, 
            added_count, run_on_set);
    }

    if (table->flags & EcsTableHasSwitch) {
        ecs_components_switch(world, table, data, row, count, added, NULL);
    }

    if (table->flags & EcsTableHasOnAdd) {
        ecs_components_on_add(world, table, data, row, count, 
            cinfo, added_count);
    }
}